

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O1

void Am_Animation_Abort_Do_proc(Am_Object *inter)

{
  Am_Value *in_value;
  Am_Value value;
  Am_Value local_38;
  Am_Object local_28;
  Am_Value local_20;
  
  Am_Object::Am_Object(&local_28,inter);
  Am_Stop_Timer(&local_28,0xe8);
  Am_Object::~Am_Object(&local_28);
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(inter,0xc5,1);
  Am_Value::operator=(&local_38,in_value);
  Am_Value::Am_Value(&local_20,&local_38);
  call_all_commands(&local_20,0xc9,inter,&Am_No_Time,true);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animation_Abort_Do,
                 (Am_Object inter))
{
  Am_Stop_Timer(inter, Am_ANIMATION_METHOD);
  Am_Value value;
  value = inter.Peek(Am_COMMAND);
  call_all_commands(value, Am_ABORT_DO_METHOD, inter, Am_No_Time, true);
}